

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::runPasses(BaseBuilder *this)

{
  uint uVar1;
  Environment EVar2;
  long *plVar3;
  BaseEmitter *in_RDI;
  Pass *pass;
  iterator __end2;
  iterator __begin2;
  ZoneVector<asmjit::v1_14::Pass_*> *__range2;
  Error err;
  PostponedErrorHandler postponed;
  ErrorHandler *prev;
  PostponedErrorHandler *in_stack_fffffffffffffe60;
  PostponedErrorHandler *in_stack_fffffffffffffe68;
  BaseEmitter *in_stack_fffffffffffffe70;
  ulong local_188;
  ResetPolicy in_stack_fffffffffffffe84;
  Zone *in_stack_fffffffffffffe88;
  Environment local_138;
  int local_124;
  ErrorHandler local_120;
  undefined1 local_118 [8];
  ulong local_110;
  PostponedErrorHandler *local_100;
  ErrorHandler *local_70;
  Error local_5c;
  Environment *local_58;
  Environment *local_48;
  Environment *local_40;
  undefined1 *local_38;
  BaseEmitter *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  BaseEmitter *local_18;
  Environment *local_10;
  Environment *local_8;
  
  if (in_RDI->_code == (CodeHolder *)0x0) {
    local_5c = DebugUtils::errored(5);
  }
  else {
    local_58 = &in_RDI[2]._environment;
    if (in_RDI[2]._gpSignature._bits == 0) {
      local_5c = 0;
    }
    else {
      local_70 = in_RDI->_errorHandler;
      PostponedErrorHandler::PostponedErrorHandler(in_stack_fffffffffffffe60);
      local_124 = 0;
      BaseEmitter::setErrorHandler(in_RDI,&local_120);
      local_48 = &in_RDI[2]._environment;
      EVar2 = *local_48;
      uVar1 = in_RDI[2]._gpSignature._bits;
      local_40 = local_48;
      local_10 = local_48;
      local_8 = local_48;
      for (local_138 = *local_48; local_138 != (Environment)((long)EVar2 + (ulong)uVar1 * 8);
          local_138 = (Environment)((long)local_138 + 8)) {
        plVar3 = *(long **)local_138;
        Zone::reset(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        local_124 = (**(code **)(*plVar3 + 0x10))(plVar3,&in_RDI[1]._gpSignature,in_RDI->_logger);
        if (local_124 != 0) break;
      }
      Zone::reset(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
      BaseEmitter::setErrorHandler(in_RDI,local_70);
      if (local_124 == 0) {
        local_5c = 0;
      }
      else {
        local_38 = local_118;
        if (local_118[0] < 0x1f) {
          local_188 = (ulong)local_118[0];
        }
        else {
          local_188 = local_110;
        }
        if (local_188 == 0) {
          in_stack_fffffffffffffe60 = (PostponedErrorHandler *)0x0;
          local_100 = in_stack_fffffffffffffe68;
        }
        else {
          in_stack_fffffffffffffe70 = (BaseEmitter *)local_118;
          in_stack_fffffffffffffe60 = local_100;
          local_30 = in_stack_fffffffffffffe70;
          local_18 = in_stack_fffffffffffffe70;
          if (local_118[0] < 0x1f) {
            local_100 = (PostponedErrorHandler *)(local_118 + 1);
            in_stack_fffffffffffffe60 = local_100;
          }
        }
        local_28 = local_38;
        local_20 = local_38;
        local_5c = BaseEmitter::reportError
                             (in_stack_fffffffffffffe70,(Error)((ulong)local_100 >> 0x20),
                              (char *)in_stack_fffffffffffffe60);
      }
      PostponedErrorHandler::~PostponedErrorHandler(in_stack_fffffffffffffe60);
    }
  }
  return local_5c;
}

Assistant:

Error BaseBuilder::runPasses() {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (_passes.empty())
    return kErrorOk;

  ErrorHandler* prev = errorHandler();
  PostponedErrorHandler postponed;

  Error err = kErrorOk;
  setErrorHandler(&postponed);

  for (Pass* pass : _passes) {
    _passZone.reset();
    err = pass->run(&_passZone, _logger);
    if (err)
      break;
  }
  _passZone.reset();
  setErrorHandler(prev);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err, !postponed._message.empty() ? postponed._message.data() : nullptr);

  return kErrorOk;
}